

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly1,
          MP<8UL,_GF2::MOGrevlex<8UL>_> *poly2)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  p_Var5 = (poly1->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var6 = p_Var5->_M_next;
  if (p_Var6 != (_List_node_base *)poly1) {
    uVar2 = (ulong)p_Var5[1]._M_next;
    uVar3 = (ulong)(poly2->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                   super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                   super__List_node_base._M_next[1]._M_next;
    do {
      uVar4 = *(ulong *)&((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)(p_Var6 + 1))->
                         super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)(uVar4 | ~uVar2 & uVar3);
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var6 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var6->_M_next)->
               super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var6 != (_List_node_base *)poly1);
  }
  p_Var5 = (poly2->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var6 = p_Var5->_M_next;
  if (p_Var6 != (_List_node_base *)poly2) {
    uVar2 = (ulong)p_Var5[1]._M_next;
    uVar3 = (ulong)(poly1->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                   super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                   super__List_node_base._M_next[1]._M_next;
    do {
      uVar4 = *(ulong *)&((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)(p_Var6 + 1))->
                         super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)(uVar4 | ~uVar2 & uVar3);
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var6 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var6->_M_next)->
               super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var6 != (_List_node_base *)poly2);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}